

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::MeshLoader::initializeNormalsOffset(MeshLoader *this)

{
  InputShared *this_00;
  unsigned_long_long uVar1;
  URI *this_01;
  SourceBase *this_02;
  size_t sVar2;
  SourceArrayLoader *in_RDI;
  unsigned_long_long stride;
  SourceBase *sourceBase;
  InputShared *normalInput;
  MeshPrimitiveInputList *in_stack_ffffffffffffffe0;
  SourceArrayLoader *this_03;
  
  this_03 = in_RDI;
  this_00 = MeshPrimitiveInputList::getNormalInput(in_stack_ffffffffffffffe0);
  if (this_00 == (InputShared *)0x0) {
    *(undefined4 *)&in_RDI[3].mCurrentSourceId._M_string_length = 0;
    *(undefined1 *)((long)&in_RDI[3].mCurrentSourceId._M_string_length + 4) = 0;
  }
  else {
    uVar1 = InputShared::getOffset(this_00);
    *(unsigned_long_long *)&in_RDI[3].mCurrentSourceId = uVar1;
    this_01 = InputUnshared::getSource(&this_00->super_InputUnshared);
    COLLADABU::URI::getFragment_abi_cxx11_(this_01);
    this_02 = SourceArrayLoader::getSourceById(this_03,(String *)this_00);
    if (this_02 == (SourceBase *)0x0) {
      *(undefined4 *)&in_RDI[3].mCurrentSourceId._M_string_length = 0;
      *(undefined1 *)((long)&in_RDI[3].mCurrentSourceId._M_string_length + 4) = 0;
    }
    else {
      uVar1 = SourceBase::getStride(this_02);
      if (uVar1 == 3) {
        sVar2 = SourceBase::getInitialIndex(this_02);
        *(int *)&in_RDI[3].mCurrentSourceId._M_string_length = (int)(sVar2 / uVar1);
        *(undefined1 *)((long)&in_RDI[3].mCurrentSourceId._M_string_length + 4) = 1;
      }
      else {
        *(undefined4 *)&in_RDI[3].mCurrentSourceId._M_string_length = 0;
        *(undefined1 *)((long)&in_RDI[3].mCurrentSourceId._M_string_length + 4) = 0;
      }
    }
  }
  return;
}

Assistant:

void MeshLoader::initializeNormalsOffset ()
    {
        // Check for using normals
        const InputShared* normalInput = mMeshPrimitiveInputs.getNormalInput ();
        if ( normalInput != 0 ) 
        {
            // Get the offset value, the initial index values and alloc the memory.
            mNormalsOffset = normalInput->getOffset ();
            const SourceBase* sourceBase = getSourceById ( normalInput->getSource ().getFragment () );
            if ( !sourceBase )
            {
                mNormalsIndexOffset = 0;
                mUseNormals = false;
            }
            else 
            {
                // only stride 3 makes sense for normals
                unsigned long long stride = sourceBase->getStride();
                if ( stride == 3 )
                {
                    mNormalsIndexOffset = (unsigned int)(sourceBase->getInitialIndex() / stride);
                    mUseNormals = true;
                }
                else
                {
                    mNormalsIndexOffset = 0;
                    mUseNormals = false;
                }
            }
        }
        else
        {
            mNormalsIndexOffset = 0;
            mUseNormals = false;
        }
    }